

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O3

gzFile gz_open(char *path,int fd,char *mode)

{
  byte bVar1;
  gz_statep state;
  size_t sVar2;
  char *__dest;
  __off_t _Var3;
  int __oflag;
  int iVar4;
  byte *pbVar5;
  
  state = (gz_statep)malloc(0xe8);
  if (state != (gz_statep)0x0) {
    state->size = 0;
    state->want = 0x2000;
    state->msg = (char *)0x0;
    state->mode = 0;
    state->level = -1;
    state->strategy = 0;
    bVar1 = *mode;
    if (bVar1 != 0) {
      pbVar5 = (byte *)(mode + 1);
      iVar4 = 0;
      do {
        if ((byte)(bVar1 - 0x30) < 10) {
          state->level = (uint)(byte)(bVar1 - 0x30);
        }
        else if (bVar1 < 0x66) {
          if (bVar1 < 0x52) {
            if (bVar1 == 0x46) {
              state->strategy = 4;
            }
            else if (bVar1 == 0x2b) goto LAB_004b3bf2;
          }
          else if (bVar1 == 0x52) {
            state->strategy = 3;
          }
          else if (bVar1 == 0x61) {
            state->mode = 1;
            iVar4 = 1;
          }
        }
        else if (bVar1 < 0x72) {
          if (bVar1 == 0x66) {
            state->strategy = 1;
          }
          else if (bVar1 == 0x68) {
            state->strategy = 2;
          }
        }
        else if (bVar1 == 0x77) {
          state->mode = 0x79b1;
          iVar4 = 0x79b1;
        }
        else if (bVar1 == 0x72) {
          state->mode = 0x1c4f;
          iVar4 = 0x1c4f;
        }
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar1 != 0);
      if (iVar4 != 0) {
        sVar2 = strlen(path);
        __dest = (char *)malloc(sVar2 + 1);
        state->path = __dest;
        if (__dest != (char *)0x0) {
          strcpy(__dest,path);
          if (fd != -1) {
            state->fd = fd;
LAB_004b3bac:
            if (iVar4 == 0x1c4f) {
              _Var3 = lseek(fd,0,1);
              if (_Var3 == -1) {
                _Var3 = 0;
              }
              state->start = _Var3;
            }
            else if (iVar4 == 1) {
              state->mode = 0x79b1;
            }
            gz_reset(state);
            return state;
          }
          __oflag = (uint)(iVar4 != 0x79b1) * 0x200 + 0x241;
          if (iVar4 == 0x1c4f) {
            __oflag = 0;
          }
          fd = open(path,__oflag,0x1b6);
          state->fd = fd;
          if (fd != -1) goto LAB_004b3bac;
          free(__dest);
        }
      }
    }
LAB_004b3bf2:
    free(state);
  }
  return (gzFile)0x0;
}

Assistant:

local gzFile gz_open(const char *path, int fd, const char *mode)
{
    gz_statep state;

    /* allocate gzFile structure to return */
    state = (gz_statep)malloc(sizeof(gz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = GZBUFSIZE;    /* requested buffer size */
    state->msg = NULL;          /* no error message yet */

    /* interpret mode */
    state->mode = GZ_NONE;
    state->level = Z_DEFAULT_COMPRESSION;
    state->strategy = Z_DEFAULT_STRATEGY;
    while (*mode) {
        if (*mode >= '0' && *mode <= '9')
            state->level = *mode - '0';
        else
            switch (*mode) {
            case 'r':
                state->mode = GZ_READ;
                break;
#ifndef NO_GZCOMPRESS
            case 'w':
                state->mode = GZ_WRITE;
                break;
            case 'a':
                state->mode = GZ_APPEND;
                break;
#endif
            case '+':       /* can't read and write at the same time */
                free(state);
                return NULL;
            case 'b':       /* ignore -- will request binary anyway */
                break;
            case 'f':
                state->strategy = Z_FILTERED;
                break;
            case 'h':
                state->strategy = Z_HUFFMAN_ONLY;
                break;
            case 'R':
                state->strategy = Z_RLE;
                break;
            case 'F':
                state->strategy = Z_FIXED;
            default:        /* could consider as an error, but just ignore */
                ;
            }
        mode++;
    }

    /* must provide an "r", "w", or "a" */
    if (state->mode == GZ_NONE) {
        free(state);
        return NULL;
    }

    /* save the path name for error messages */
    state->path = (char *)malloc(strlen(path) + 1);
    if (state->path == NULL) {
        free(state);
        return NULL;
    }
    strcpy(state->path, path);

    /* open the file with the appropriate mode (or just use fd) */
    state->fd = fd != -1 ? fd :
        open(path,
#ifdef O_LARGEFILE
            O_LARGEFILE |
#endif
#ifdef O_BINARY
            O_BINARY |
#endif
            (state->mode == GZ_READ ?
                O_RDONLY :
                (O_WRONLY | O_CREAT | (
                    state->mode == GZ_WRITE ?
                        O_TRUNC :
                        O_APPEND))),
            0666);
    if (state->fd == -1) {
        free(state->path);
        free(state);
        return NULL;
    }
    if (state->mode == GZ_APPEND)
        state->mode = GZ_WRITE;         /* simplify later checks */

    /* save the current position for rewinding (only if reading) */
    if (state->mode == GZ_READ) {
        state->start = LSEEK(state->fd, 0, SEEK_CUR);
        if (state->start == -1) state->start = 0;
    }

    /* initialize stream */
    gz_reset(state);

    /* return stream */
    return (gzFile)state;
}